

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qhash.h
# Opt level: O3

void __thiscall
QHashPrivate::Span<QHashPrivate::Node<ProKey,_QHashDummyValue>_>::erase
          (Span<QHashPrivate::Node<ProKey,_QHashDummyValue>_> *this,size_t bucket)

{
  byte bVar1;
  Entry *pEVar2;
  int *piVar3;
  uint uVar4;
  
  bVar1 = this->offsets[bucket];
  this->offsets[bucket] = 0xff;
  pEVar2 = this->entries;
  uVar4 = (uint)bVar1 * 0x30;
  piVar3 = *(int **)((pEVar2->storage).data + uVar4);
  if (piVar3 != (int *)0x0) {
    LOCK();
    *piVar3 = *piVar3 + -1;
    UNLOCK();
    if (*piVar3 == 0) {
      QArrayData::deallocate(*(QArrayData **)((pEVar2->storage).data + uVar4),2,0x10);
    }
  }
  (this->entries->storage).data[(uint)bVar1 * 0x30] = this->nextFree;
  this->nextFree = bVar1;
  return;
}

Assistant:

void erase(size_t bucket) noexcept(std::is_nothrow_destructible<Node>::value)
    {
        Q_ASSERT(bucket < SpanConstants::NEntries);
        Q_ASSERT(offsets[bucket] != SpanConstants::UnusedEntry);

        unsigned char entry = offsets[bucket];
        offsets[bucket] = SpanConstants::UnusedEntry;

        entries[entry].node().~Node();
        entries[entry].nextFree() = nextFree;
        nextFree = entry;
    }